

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

int __thiscall QMenuPrivate::init(QMenuPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QObject *parent;
  QMenuPrivate *this_00;
  QStyle *pQVar2;
  QMenuScroller *this_01;
  long in_FS_OFFSET;
  undefined4 unaff_retaddr;
  WidgetAttribute unaff_retaddr_00;
  QWidget *in_stack_00000008;
  offset_in_QAction_to_subr in_stack_00000020;
  QMenu *q;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  QWidget *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar4;
  Connection in_stack_fffffffffffffff0;
  ContextType *context;
  
  context = *(ContextType **)(in_FS_OFFSET + 0x28);
  parent = (QObject *)q_func(this);
  uVar4 = 1;
  QWidget::setAttribute(in_stack_00000008,unaff_retaddr_00,SUB41((uint)unaff_retaddr >> 0x18,0));
  QWidget::setAttribute(in_stack_00000008,unaff_retaddr_00,SUB41((uint)unaff_retaddr >> 0x18,0));
  this_00 = (QMenuPrivate *)operator_new(0x10);
  QAction::QAction((QAction *)this_00,parent);
  this->menuAction = (QAction *)this_00;
  this->defaultMenuAction = (QAction *)this_00;
  QAction::setMenu<QMenu*>
            ((QAction *)in_stack_ffffffffffffffa0,
             (QMenu *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  setOverrideMenuAction(this_00,(QAction *)CONCAT44(uVar4,in_stack_ffffffffffffffa8));
  uVar3 = 0;
  QObject::connect<void(QAction::*)(),QMenuPrivate::init()::__0>
            ((Object *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_00000020,context,
             (anon_class_8_1_8991fb9c_for_o *)in_stack_fffffffffffffff0.d_ptr,(ConnectionType)q);
  QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
  pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,uVar3));
  (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x14,0,parent);
  QWidget::setMouseTracking
            (in_stack_ffffffffffffffa0,SUB41((uint)in_stack_ffffffffffffff9c >> 0x18,0));
  pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,uVar3));
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x1e,0,parent);
  if (iVar1 != 0) {
    this_01 = (QMenuScroller *)operator_new(0xc);
    QMenuScroller::QMenuScroller(this_01);
    this->scroll = this_01;
    this->scroll->scrollFlags = '\0';
  }
  QMenuSloppyState::initialize
            ((QMenuSloppyState *)this_00,(QMenu *)CONCAT44(uVar4,in_stack_ffffffffffffffa8));
  DelayState::initialize(&this->delayState,(QMenu *)parent);
  pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,uVar3));
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x10,0,parent);
  this->mousePopupDelay = iVar1;
  if (*(ContextType **)(in_FS_OFFSET + 0x28) == context) {
    return (int)*(ContextType **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::init()
{
    Q_Q(QMenu);
#if QT_CONFIG(whatsthis)
    q->setAttribute(Qt::WA_CustomWhatsThis);
#endif
    q->setAttribute(Qt::WA_X11NetWmWindowTypePopupMenu);
    defaultMenuAction = menuAction = new QAction(q);
    menuAction->setMenu(q); // this calls setOverrideMenuAction
    setOverrideMenuAction(nullptr);
    QObject::connect(menuAction, &QAction::changed, q, [this] {
        if (!tornPopup.isNull())
            tornPopup->updateWindowTitle();
    });
    q->setMouseTracking(q->style()->styleHint(QStyle::SH_Menu_MouseTracking, nullptr, q));
    if (q->style()->styleHint(QStyle::SH_Menu_Scrollable, nullptr, q)) {
        scroll = new QMenuPrivate::QMenuScroller;
        scroll->scrollFlags = QMenuPrivate::QMenuScroller::ScrollNone;
    }

    sloppyState.initialize(q);
    delayState.initialize(q);
    mousePopupDelay = q->style()->styleHint(QStyle::SH_Menu_SubMenuPopupDelay, nullptr, q);
}